

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test2(void)

{
  int *piVar1;
  ostream *poVar2;
  initializer_list<int> __l;
  allocator_type local_59;
  Queue q;
  vector<int,_std::allocator<int>_> v;
  
  q.mData = (int *)0x200000001;
  q.mCap = 0x400000003;
  q.mSize._0_4_ = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&q;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,&local_59);
  CP::queue<int>::queue
            (&q,(iterator)
                (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + 1),
             (iterator)
             (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start + 4));
  while (CONCAT44(q.mSize._4_4_,(undefined4)q.mSize) != 0) {
    piVar1 = CP::queue<int>::front(&q);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar1);
    std::operator<<(poVar2," ");
    CP::queue<int>::pop(&q);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  CP::queue<int>::~queue(&q);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return true;
}

Assistant:

bool test2() {
  vector<int> v = {1, 2, 3, 4, 5};
  Queue q(v.begin() + 1,v.begin() + 4);
  while (!q.empty()) {
    cout << q.front() << " ";
    q.pop();
  }
  cout << endl;
  return true;
}